

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_helper.h
# Opt level: O3

seconds_count date::calendar_helper::to_seconds_count(date_time *dt)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(dt->super_date).month;
  uVar1 = uVar2 + 0xc;
  if (uVar2 >= 3) {
    uVar1 = uVar2;
  }
  uVar2 = (ulong)(dt->super_date).year - (ulong)(uVar2 < 3);
  return (((((uVar2 >> 2) + (ulong)(dt->super_date).day + uVar2 * 0x16d) - (uVar2 >> 2) / 0x19) +
           uVar2 / 400 + (uVar1 * 0x99 - 0x1c9) / 5) * 0x15180 +
         (ulong)(dt->super_time).second +
         (ulong)(dt->super_time).minute * 0x3c + (ulong)(dt->super_time).hour * 0xe10) - 0x1936b00;
}

Assistant:

static seconds_count to_seconds_count(const date_time& dt)
    {
        const seconds_count k = (dt.month < 3 ? 1 : 0);
        const seconds_count m = dt.month + 12 * k;
        const seconds_count y = dt.year - k;
        const seconds_count d = dt.day + (153 * m - 457) / 5 + 365 * y + (y / 4) - (y / 100) + (y / 400) - 306;
        return static_cast<seconds_count>(d * 24 * 60 * 60 + dt.hour * 60 * 60 + dt.minute * 60 + dt.second);
    }